

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.cpp
# Opt level: O2

void __thiscall icu_63::number::impl::DecimalFormatProperties::clear(DecimalFormatProperties *this)

{
  CurrencyPluralInfo *pCVar1;
  
  (this->compactStyle).fNull = true;
  (this->currency).fNull = true;
  pCVar1 = (this->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr;
  if (pCVar1 != (CurrencyPluralInfo *)0x0) {
    (*(pCVar1->super_UObject)._vptr_UObject[1])();
  }
  (this->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr =
       (CurrencyPluralInfo *)0x0;
  (this->currencyUsage).fNull = true;
  this->decimalPatternMatchRequired = false;
  this->decimalSeparatorAlwaysShown = false;
  this->exponentSignAlwaysShown = false;
  this->formatFailIfMoreThanMaxDigits = false;
  this->formatWidth = -1;
  this->groupingSize = -1;
  this->groupingUsed = true;
  this->magnitudeMultiplier = 0;
  this->maximumFractionDigits = -1;
  this->maximumIntegerDigits = -1;
  this->maximumSignificantDigits = -1;
  this->minimumExponentDigits = -1;
  this->minimumFractionDigits = -1;
  this->minimumGroupingDigits = -1;
  this->minimumIntegerDigits = -1;
  this->minimumSignificantDigits = -1;
  this->multiplier = 1;
  this->multiplierScale = 0;
  UnicodeString::setToBogus(&this->negativePrefix);
  UnicodeString::setToBogus(&this->negativePrefixPattern);
  UnicodeString::setToBogus(&this->negativeSuffix);
  UnicodeString::setToBogus(&this->negativeSuffixPattern);
  (this->padPosition).fNull = true;
  UnicodeString::setToBogus(&this->padString);
  this->parseCaseSensitive = false;
  this->parseIntegerOnly = false;
  (this->parseMode).fNull = true;
  this->parseNoExponent = false;
  this->parseToBigDecimal = false;
  this->parseAllInput = UNUM_MAYBE;
  UnicodeString::setToBogus(&this->positivePrefix);
  UnicodeString::setToBogus(&this->positivePrefixPattern);
  UnicodeString::setToBogus(&this->positiveSuffix);
  UnicodeString::setToBogus(&this->positiveSuffixPattern);
  this->roundingIncrement = 0.0;
  (this->roundingMode).fNull = true;
  this->secondaryGroupingSize = -1;
  this->signAlwaysShown = false;
  return;
}

Assistant:

void DecimalFormatProperties::clear() {
    compactStyle.nullify();
    currency.nullify();
    currencyPluralInfo.fPtr.adoptInstead(nullptr);
    currencyUsage.nullify();
    decimalPatternMatchRequired = false;
    decimalSeparatorAlwaysShown = false;
    exponentSignAlwaysShown = false;
    formatFailIfMoreThanMaxDigits = false;
    formatWidth = -1;
    groupingSize = -1;
    groupingUsed = true;
    magnitudeMultiplier = 0;
    maximumFractionDigits = -1;
    maximumIntegerDigits = -1;
    maximumSignificantDigits = -1;
    minimumExponentDigits = -1;
    minimumFractionDigits = -1;
    minimumGroupingDigits = -1;
    minimumIntegerDigits = -1;
    minimumSignificantDigits = -1;
    multiplier = 1;
    multiplierScale = 0;
    negativePrefix.setToBogus();
    negativePrefixPattern.setToBogus();
    negativeSuffix.setToBogus();
    negativeSuffixPattern.setToBogus();
    padPosition.nullify();
    padString.setToBogus();
    parseCaseSensitive = false;
    parseIntegerOnly = false;
    parseMode.nullify();
    parseNoExponent = false;
    parseToBigDecimal = false;
    parseAllInput = UNUM_MAYBE;
    positivePrefix.setToBogus();
    positivePrefixPattern.setToBogus();
    positiveSuffix.setToBogus();
    positiveSuffixPattern.setToBogus();
    roundingIncrement = 0.0;
    roundingMode.nullify();
    secondaryGroupingSize = -1;
    signAlwaysShown = false;
}